

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::TimingControlSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == CycleDelay) || (kind - Delay3 < 2)) || (kind - EventControl < 2)) ||
     (((kind == ImplicitEventControl || (kind == OneStepDelay)) || (kind == RepeatedEventControl))))
  {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TimingControlSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CycleDelay:
        case SyntaxKind::Delay3:
        case SyntaxKind::DelayControl:
        case SyntaxKind::EventControl:
        case SyntaxKind::EventControlWithExpression:
        case SyntaxKind::ImplicitEventControl:
        case SyntaxKind::OneStepDelay:
        case SyntaxKind::RepeatedEventControl:
            return true;
        default:
            return false;
    }
}